

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidobjs.c
# Opt level: O2

FT_Error cid_size_request(FT_Size size,FT_Size_Request req)

{
  PSH_Globals_Funcs pPVar1;
  
  FT_Request_Metrics(size->face,req);
  pPVar1 = cid_size_get_globals_funcs((CID_Size)size);
  if (pPVar1 != (PSH_Globals_Funcs)0x0) {
    (*pPVar1->set_scale)
              ((PSH_Globals)size->internal->module_data,(size->metrics).x_scale,
               (size->metrics).y_scale,0,0);
  }
  return 0;
}

Assistant:

FT_LOCAL( FT_Error )
  cid_size_request( FT_Size          size,
                    FT_Size_Request  req )
  {
    PSH_Globals_Funcs  funcs;


    FT_Request_Metrics( size->face, req );

    funcs = cid_size_get_globals_funcs( (CID_Size)size );

    if ( funcs )
      funcs->set_scale( (PSH_Globals)size->internal->module_data,
                        size->metrics.x_scale,
                        size->metrics.y_scale,
                        0, 0 );

    return FT_Err_Ok;
  }